

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QWidget_*>::append(QList<QWidget_*> *this,QList<QWidget_*> *other)

{
  bool bVar1;
  DataOps *b;
  QArrayDataPointer<QWidget_*> *pQVar2;
  QArrayDataPointer<QWidget_*> *in_RSI;
  QArrayDataPointer<QWidget_*> *in_RDI;
  QArrayDataPointer<QWidget_*> *unaff_retaddr;
  QArrayDataPointer<QWidget_*> *in_stack_ffffffffffffffe0;
  GrowthPosition where;
  
  pQVar2 = in_RDI;
  bVar1 = isEmpty((QList<QWidget_*> *)0x49c0b6);
  where = (GrowthPosition)((ulong)pQVar2 >> 0x20);
  if (!bVar1) {
    QArrayDataPointer<QWidget_*>::operator->(in_RSI);
    bVar1 = QArrayDataPointer<QWidget_*>::needsDetach(in_stack_ffffffffffffffe0);
    if (bVar1) {
      append((QList<QWidget_*> *)in_RSI,(QList<QWidget_*> *)in_RDI);
    }
    else {
      size((QList<QWidget_*> *)in_RSI);
      QArrayDataPointer<QWidget_*>::detachAndGrow
                (unaff_retaddr,where,(qsizetype)in_RSI,(QWidget ***)in_RDI,in_stack_ffffffffffffffe0
                );
      b = QArrayDataPointer<QWidget_*>::operator->(in_RDI);
      QArrayDataPointer<QWidget_*>::operator->(in_RSI);
      pQVar2 = (QArrayDataPointer<QWidget_*> *)
               QArrayDataPointer<QWidget_*>::begin((QArrayDataPointer<QWidget_*> *)0x49c12b);
      QArrayDataPointer<QWidget_*>::operator->(in_RSI);
      QArrayDataPointer<QWidget_*>::end(pQVar2);
      QtPrivate::QPodArrayOps<QWidget_*>::moveAppend
                ((QPodArrayOps<QWidget_*> *)pQVar2,(QWidget **)b,(QWidget **)0x49c153);
    }
  }
  return;
}

Assistant:

inline void QList<T>::append(QList<T> &&other)
{
    Q_ASSERT(&other != this);
    if (other.isEmpty())
        return;
    if (other.d->needsDetach() || !std::is_nothrow_move_constructible_v<T>)
        return append(other);

    // due to precondition &other != this, we can unconditionally modify 'this'
    d.detachAndGrow(QArrayData::GrowsAtEnd, other.size(), nullptr, nullptr);
    Q_ASSERT(d.freeSpaceAtEnd() >= other.size());
    d->moveAppend(other.d->begin(), other.d->end());
}